

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall kj::Disposer::dispose<capnp::MessageReader>(Disposer *this,MessageReader *object)

{
  code *local_30;
  MessageReader *object_local;
  Disposer *this_local;
  
  if (object == (MessageReader *)0x0) {
    local_30 = (code *)0x0;
  }
  else {
    local_30 = (code *)((long)object->arenaSpace + (long)(object->_vptr_MessageReader[-2] + -0x18));
  }
  (**this->_vptr_Disposer)(this,local_30);
  return;
}

Assistant:

void Disposer::dispose(T* object) const {
  if constexpr (_kj_internal_isPolymorphic((T*)nullptr)) {
    // Note that dynamic_cast<void*> does not require RTTI to be enabled, because the offset to
    // the top of the object is in the vtable -- as it obviously needs to be to correctly implement
    // operator delete.
    disposeImpl(dynamic_cast<void*>(object));
  } else {
    disposeImpl(static_cast<void*>(object));
  }
}